

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

QString * qt_strippedText(QString *__return_storage_ptr__,QString *s)

{
  ulong uVar1;
  QString *pQVar2;
  ulong uVar3;
  QLatin1String QVar4;
  
  QVar4.m_data = (char *)0x3;
  QVar4.m_size = (qsizetype)s;
  QString::remove(QVar4,0x69edd7);
  uVar1 = (s->d).size;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if ((s->d).ptr[uVar3] == L'&') {
        QString::remove((longlong)s,uVar3);
        uVar1 = (s->d).size;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  pQVar2 = (QString *)QString::trimmed_helper((QString *)__return_storage_ptr__);
  return pQVar2;
}

Assistant:

static QString qt_strippedText(QString s)
{
    s.remove("..."_L1);
    for (int i = 0; i < s.size(); ++i) {
        if (s.at(i) == u'&')
            s.remove(i, 1);
    }
    return s.trimmed();
}